

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuiRendererSDL.cpp
# Opt level: O0

string * __thiscall
ImGuiRendererSDL::loadTextureFromFile
          (ImGuiRendererSDL *this,path *filepath,GLuint *out_texture,int *out_width,int *out_height)

{
  bool bVar1;
  GLenum GVar2;
  ulong uVar3;
  path *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  GLuint *in_RCX;
  string *in_RDI;
  int *in_R8;
  int *in_R9;
  GLenum code;
  GLuint image_texture;
  string *in_stack_000001c0;
  path *in_stack_000001c8;
  int glMaxTextureSize;
  uchar *image_data;
  vector<char,_std::allocator<char>_> buf;
  string error_msg;
  int image_height;
  int image_width;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffc54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  path *in_stack_fffffffffffffc78;
  uint __val;
  string *__lhs_00;
  string *this_01;
  int __val_00;
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [28];
  int in_stack_fffffffffffffd1c;
  int *in_stack_fffffffffffffd20;
  int *in_stack_fffffffffffffd28;
  int *in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd40;
  GLuint in_stack_fffffffffffffd44;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [36];
  int local_134;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  undefined4 local_c4;
  string local_c0 [32];
  string local_a0 [48];
  vector<char,_std::allocator<char>_> local_70;
  string local_58 [32];
  int local_38;
  int local_34;
  int *local_30;
  int *local_28;
  GLuint *local_20;
  
  local_34 = 0;
  local_38 = 0;
  this_01 = local_58;
  __lhs_00 = in_RDI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  std::__cxx11::string::string(this_01);
  __val_00 = (int)((ulong)this_01 >> 0x20);
  file_as_buffer(in_stack_000001c8,in_stack_000001c0);
  bVar1 = std::vector<char,_std::allocator<char>_>::empty(in_stack_fffffffffffffc60);
  if (!bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      this_00 = (path *)std::vector<char,_std::allocator<char>_>::data
                                  ((vector<char,_std::allocator<char>_> *)0x193866);
      std::vector<char,_std::allocator<char>_>::size(&local_70);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              stbi_load_from_memory
                        ((stbi_uc *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                         in_stack_fffffffffffffd3c,in_stack_fffffffffffffd30,
                         in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
                         in_stack_fffffffffffffd1c);
      local_d0 = __rhs;
      if (__rhs == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::filesystem::__cxx11::path::string(this_00);
        std::operator+((char *)in_stack_fffffffffffffc58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        std::operator+(in_stack_fffffffffffffc58,
                       (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        stbi_failure_reason();
        std::operator+(in_stack_fffffffffffffc58,
                       (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        std::__cxx11::string::~string(local_f0);
        std::__cxx11::string::~string(local_110);
        std::__cxx11::string::~string(local_130);
      }
      else {
        (*glad_glGetIntegerv)(0xd33,&local_134);
        if (local_134 < local_34) {
          std::filesystem::__cxx11::path::string(this_00);
          std::operator+(in_stack_fffffffffffffc58,
                         (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
          std::__cxx11::to_string(__val_00);
          std::operator+(__lhs_00,__rhs);
          std::operator+(in_stack_fffffffffffffc58,
                         (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
          std::__cxx11::to_string(__val_00);
          std::operator+(__lhs_00,__rhs);
          std::__cxx11::string::~string(local_1f8);
          std::__cxx11::string::~string(local_158);
          std::__cxx11::string::~string(local_178);
          std::__cxx11::string::~string(local_1d8);
          std::__cxx11::string::~string(local_198);
          std::__cxx11::string::~string(local_1b8);
        }
        else if (local_134 < local_38) {
          std::filesystem::__cxx11::path::string(this_00);
          std::operator+(in_stack_fffffffffffffc58,
                         (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
          std::__cxx11::to_string(__val_00);
          std::operator+(__lhs_00,__rhs);
          std::operator+(in_stack_fffffffffffffc58,
                         (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
          std::__cxx11::to_string(__val_00);
          std::operator+(__lhs_00,__rhs);
          std::__cxx11::string::~string(local_2b8);
          std::__cxx11::string::~string(local_218);
          std::__cxx11::string::~string(local_238);
          std::__cxx11::string::~string(local_298);
          std::__cxx11::string::~string(local_258);
          std::__cxx11::string::~string(local_278);
        }
        else {
          (*glad_glGenTextures)(1,(GLuint *)&stack0xfffffffffffffd44);
          (*glad_glBindTexture)(0xde1,in_stack_fffffffffffffd44);
          (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
          (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
          (*glad_glPixelStorei)(0xcf2,0);
          uVar4 = 0x1401;
          __lhs = local_d0;
          (*glad_glTexImage2D)(0xde1,0,0x1908,local_34,local_38,0,0x1908,0x1401,local_d0);
          GVar2 = (*glad_glGetError)();
          if (GVar2 == 0x505) {
            std::filesystem::__cxx11::path::string(this_00);
            std::operator+(__lhs,(char *)CONCAT44(in_stack_fffffffffffffc54,uVar4));
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffd20);
          }
          else if (GVar2 == 0) {
            stbi_image_free((void *)0x1940be);
            *local_20 = in_stack_fffffffffffffd44;
            *local_28 = local_34;
            *local_30 = local_38;
            std::__cxx11::string::string((string *)__lhs_00);
          }
          else {
            std::filesystem::__cxx11::path::string(this_00);
            __val = (uint)((ulong)this_00 >> 0x20);
            std::operator+(__lhs,(char *)CONCAT44(in_stack_fffffffffffffc54,uVar4));
            std::__cxx11::to_string(__val);
            std::operator+(__lhs_00,__rhs);
            std::operator+(__lhs,(char *)CONCAT44(in_stack_fffffffffffffc54,uVar4));
            std::__cxx11::string::~string(local_300);
            std::__cxx11::string::~string(local_360);
            std::__cxx11::string::~string(local_320);
            std::__cxx11::string::~string(local_340);
          }
        }
      }
      goto LAB_00194106;
    }
  }
  std::filesystem::__cxx11::path::string(in_stack_fffffffffffffc78);
  std::operator+(in_stack_fffffffffffffc58,
                 (char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  std::operator+(in_stack_fffffffffffffc58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
LAB_00194106:
  local_c4 = 1;
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffc60);
  std::__cxx11::string::~string(local_58);
  return in_RDI;
}

Assistant:

std::string ImGuiRendererSDL::loadTextureFromFile(const filesystem::path &filepath, GLuint* out_texture, int* out_width, int* out_height)
{
	// Load from file
	int image_width = 0;
	int image_height = 0;

	std::string error_msg;
	auto buf = file_as_buffer(filepath, error_msg);
	if (buf.empty() || !error_msg.empty()) {
		return filepath.string() + ": " + error_msg;
	}
	unsigned char* image_data = stbi_load_from_memory(reinterpret_cast<unsigned char*>(buf.data()), buf.size(), &image_width, &image_height, NULL, 4);

	if (image_data == nullptr) {
		return "Could not load image from " + filepath.string() + ": " + stbi_failure_reason();
	}

	int glMaxTextureSize;
	glGetIntegerv(GL_MAX_TEXTURE_SIZE, &glMaxTextureSize);
	if (image_width > glMaxTextureSize) {
		return filepath.string() + ": width of " + std::to_string(image_width) + "px is too large for this GPU. Maximum allowed: " + std::to_string(glMaxTextureSize);
	}

	if (image_height > glMaxTextureSize) {
		return filepath.string() + ": height of " + std::to_string(image_width) + "px is too large for this GPU. Maximum allowed: " + std::to_string(glMaxTextureSize);
	}

	// Create a OpenGL texture identifier
	GLuint image_texture;
	glGenTextures(1, &image_texture);
	glBindTexture(GL_TEXTURE_2D, image_texture);

	// Setup filtering parameters for display
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

	// Upload pixels into texture
	glPixelStorei(GL_UNPACK_ROW_LENGTH, 0);
	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, image_width, image_height, 0, GL_RGBA, GL_UNSIGNED_BYTE, image_data);

	GLenum code = glGetError();
	if (code == GL_OUT_OF_MEMORY) {
		return filepath.string() + ": image too large to fit in the GPU memory.";
	}
	if (code != GL_NO_ERROR) {
		return filepath.string() + ": error " + std::to_string(code) + " when loading the image into GPU memory.";
	}

	stbi_image_free(image_data);

	*out_texture = image_texture;
	*out_width = image_width;
	*out_height = image_height;

	return {};
}